

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

int memory_tree_ns::random_sample_example_pop(memory_tree *b,uint32_t *cn)

{
  uint *puVar1;
  node *pnVar2;
  uint32_t *puVar3;
  ostream *poVar4;
  uint32_t index;
  node *pnVar5;
  ulong uVar6;
  uint uVar7;
  v_array<unsigned_int> *array;
  float fVar8;
  
  *cn = 0;
  pnVar2 = (b->nodes)._begin;
  pnVar5 = pnVar2;
  if (pnVar2->internal == 1) {
    uVar6 = 0;
    do {
      if (1.0 <= pnVar5->nl) {
        if (1.0 <= pnVar5->nr) {
          if ((pnVar5->nl < 1.0) || (pnVar5->nr < 1.0)) {
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(uint)uVar6);
            poVar4 = std::operator<<(poVar4," ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(b->nodes)._begin[*cn].nl);
            poVar4 = std::operator<<(poVar4," ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(b->nodes)._begin[*cn].nr);
            std::endl<char,std::char_traits<char>>(poVar4);
            std::operator<<((ostream *)&std::cout,"Error:  nl = 0, and nr = 0, exit...");
            exit(0);
          }
          fVar8 = merand48(&b->all->random_state);
          uVar6 = (ulong)*cn;
          pnVar2 = (b->nodes)._begin;
          if (pnVar2[uVar6].nl / (pnVar2[uVar6].nr + pnVar2[uVar6].nl) <= (double)fVar8)
          goto LAB_001dd258;
        }
        pnVar2[uVar6].nl = pnVar2[uVar6].nl + -1.0;
        puVar3 = &(b->nodes)._begin[*cn].left;
      }
      else {
LAB_001dd258:
        pnVar2[uVar6].nr = pnVar2[uVar6].nr + -1.0;
        puVar3 = &(b->nodes)._begin[*cn].right;
      }
      uVar6 = (ulong)*puVar3;
      *cn = *puVar3;
      pnVar2 = (b->nodes)._begin;
      pnVar5 = pnVar2 + uVar6;
    } while (pnVar5->internal == 1);
  }
  if ((pnVar5->examples_index)._end == (pnVar5->examples_index)._begin) {
    uVar7 = 0xffffffff;
  }
  else {
    fVar8 = merand48(&b->all->random_state);
    pnVar5 = (b->nodes)._begin;
    array = &pnVar5[*cn].examples_index;
    puVar1 = array->_begin;
    index = (uint32_t)
            (fVar8 * (float)(ulong)((long)pnVar5[*cn].examples_index._end - (long)puVar1 >> 2));
    uVar7 = puVar1[(int)index];
    remove_at_index<unsigned_int>(array,index);
  }
  return uVar7;
}

Assistant:

inline int random_sample_example_pop(memory_tree& b, uint32_t& cn)
    {
        cn = 0; //always start from the root:
        while (b.nodes[cn].internal == 1)
        {
            float pred = 0.;   //deal with some edge cases:
            if (b.nodes[cn].nl < 1) //no examples routed to left ever:
                pred = 1.f; //go right.
            else if (b.nodes[cn].nr < 1) //no examples routed to right ever:
                pred = -1.f; //go left.
            else if ((b.nodes[cn].nl >= 1) && (b.nodes[cn].nr >= 1))
                pred = merand48(b.all->random_state) < (b.nodes[cn].nl*1./(b.nodes[cn].nr+b.nodes[cn].nl)) ? -1.f : 1.f;
            else{
                cout<<cn<<" "<<b.nodes[cn].nl<<" "<<b.nodes[cn].nr<<endl;
                cout<<"Error:  nl = 0, and nr = 0, exit...";
                exit(0);
            }
            
            if (pred < 0){
                b.nodes[cn].nl--;
                cn = b.nodes[cn].left; 
            }
            else{
                b.nodes[cn].nr--;
                cn = b.nodes[cn].right;
            }
        }

        if (b.nodes[cn].examples_index.size() >= 1){
            int loc_at_leaf = int(merand48(b.all->random_state)*b.nodes[cn].examples_index.size());
	        uint32_t ec_id = b.nodes[cn].examples_index[loc_at_leaf];
            remove_at_index(b.nodes[cn].examples_index, loc_at_leaf); 
            return ec_id;
        }
        else    
            return -1;
    }